

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  int iVar1;
  bool bVar2;
  ImDrawCmd *pIVar3;
  ImDrawChannel *pIVar4;
  uint local_7c;
  ImDrawCmd *local_78;
  int sz_1;
  int sz;
  ImDrawChannel *ch_1;
  unsigned_short *puStack_50;
  int i_1;
  ImDrawIdx *idx_write;
  ImDrawCmd *cmd_write;
  int cmd_n;
  ImDrawChannel *ch;
  int i;
  int idx_offset;
  ImDrawCmd *last_cmd;
  int new_idx_buffer_count;
  int new_cmd_buffer_count;
  ImDrawList *draw_list_local;
  ImDrawListSplitter *this_local;
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    if (((draw_list->CmdBuffer).Size != 0) &&
       (pIVar3 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer), pIVar3->ElemCount == 0)) {
      ImVector<ImDrawCmd>::pop_back(&draw_list->CmdBuffer);
    }
    last_cmd._4_4_ = 0;
    last_cmd._0_4_ = 0;
    if ((this->_Count < 1) || ((draw_list->CmdBuffer).Size < 1)) {
      local_78 = (ImDrawCmd *)0x0;
    }
    else {
      local_78 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
    }
    _i = local_78;
    if (local_78 == (ImDrawCmd *)0x0) {
      local_7c = 0;
    }
    else {
      local_7c = local_78->IdxOffset + local_78->ElemCount;
    }
    ch._4_4_ = local_7c;
    for (ch._0_4_ = 1; (int)ch < this->_Count; ch._0_4_ = (int)ch + 1) {
      pIVar4 = ImVector<ImDrawChannel>::operator[](&this->_Channels,(int)ch);
      if ((0 < (pIVar4->_CmdBuffer).Size) &&
         (pIVar3 = ImVector<ImDrawCmd>::back(&pIVar4->_CmdBuffer), pIVar3->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back(&pIVar4->_CmdBuffer);
      }
      if ((0 < (pIVar4->_CmdBuffer).Size) && (_i != (ImDrawCmd *)0x0)) {
        pIVar3 = ImVector<ImDrawCmd>::operator[](&pIVar4->_CmdBuffer,0);
        bVar2 = CanMergeDrawCommands(_i,pIVar3);
        if (bVar2) {
          pIVar3 = ImVector<ImDrawCmd>::operator[](&pIVar4->_CmdBuffer,0);
          _i->ElemCount = pIVar3->ElemCount + _i->ElemCount;
          pIVar3 = ImVector<ImDrawCmd>::operator[](&pIVar4->_CmdBuffer,0);
          ch._4_4_ = pIVar3->ElemCount + ch._4_4_;
          ImVector<ImDrawCmd>::erase(&pIVar4->_CmdBuffer,(pIVar4->_CmdBuffer).Data);
        }
      }
      if (0 < (pIVar4->_CmdBuffer).Size) {
        _i = ImVector<ImDrawCmd>::back(&pIVar4->_CmdBuffer);
      }
      last_cmd._4_4_ = (pIVar4->_CmdBuffer).Size + last_cmd._4_4_;
      last_cmd._0_4_ = (pIVar4->_IdxBuffer).Size + (int)last_cmd;
      for (cmd_write._4_4_ = 0; cmd_write._4_4_ < (pIVar4->_CmdBuffer).Size;
          cmd_write._4_4_ = cmd_write._4_4_ + 1) {
        (pIVar4->_CmdBuffer).Data[cmd_write._4_4_].IdxOffset = ch._4_4_;
        ch._4_4_ = (pIVar4->_CmdBuffer).Data[cmd_write._4_4_].ElemCount + ch._4_4_;
      }
    }
    ImVector<ImDrawCmd>::resize(&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + last_cmd._4_4_);
    ImVector<unsigned_short>::resize
              (&draw_list->IdxBuffer,(draw_list->IdxBuffer).Size + (int)last_cmd);
    idx_write = (ImDrawIdx *)
                ((draw_list->CmdBuffer).Data +
                ((long)(draw_list->CmdBuffer).Size - (long)last_cmd._4_4_));
    puStack_50 = (draw_list->IdxBuffer).Data +
                 ((long)(draw_list->IdxBuffer).Size - (long)(int)last_cmd);
    for (ch_1._4_4_ = 1; ch_1._4_4_ < this->_Count; ch_1._4_4_ = ch_1._4_4_ + 1) {
      pIVar4 = ImVector<ImDrawChannel>::operator[](&this->_Channels,ch_1._4_4_);
      iVar1 = (pIVar4->_CmdBuffer).Size;
      if (iVar1 != 0) {
        memcpy(idx_write,(pIVar4->_CmdBuffer).Data,(long)iVar1 * 0x38);
        idx_write = idx_write + (long)iVar1 * 0x1c;
      }
      iVar1 = (pIVar4->_IdxBuffer).Size;
      if (iVar1 != 0) {
        memcpy(puStack_50,(pIVar4->_IdxBuffer).Data,(long)iVar1 << 1);
        puStack_50 = puStack_50 + iVar1;
      }
    }
    draw_list->_IdxWritePtr = puStack_50;
    ImDrawList::UpdateClipRect(draw_list);
    ImDrawList::UpdateTextureID(draw_list);
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    if (draw_list->CmdBuffer.Size != 0 && draw_list->CmdBuffer.back().ElemCount == 0)
        draw_list->CmdBuffer.pop_back();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();
        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL && CanMergeDrawCommands(last_cmd, &ch._CmdBuffer[0]))
        {
            // Merge previous channel last draw command with current channel first draw command if matching.
            last_cmd->ElemCount += ch._CmdBuffer[0].ElemCount;
            idx_offset += ch._CmdBuffer[0].ElemCount;
            ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;
    draw_list->UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    draw_list->UpdateTextureID();
    _Count = 1;
}